

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

void MOD_SetAutoChip(DUH *duh)

{
  int iVar1;
  IT_SAMPLE *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  DUMB_IT_SIGDATA *pDVar11;
  int local_64;
  int local_60;
  int l;
  int k;
  int s2_1;
  int s1_1;
  int sus_loop_end;
  int sus_loop_start;
  int s2;
  int s1;
  int loop_end;
  int loop_start;
  int channels;
  IT_SAMPLE *sample;
  int j;
  int i;
  DUMB_IT_SIGDATA *itsd;
  int scan_threshold_16;
  int scan_threshold_8;
  int size_scan;
  int size_force;
  DUH *duh_local;
  
  iVar3 = FIntCVar::operator_cast_to_int(&mod_autochip_size_force);
  iVar4 = FIntCVar::operator_cast_to_int(&mod_autochip_size_scan);
  iVar5 = FIntCVar::operator_cast_to_int(&mod_autochip_scan_threshold);
  iVar5 = (iVar5 * 0x100 + 0x32) / 100;
  iVar6 = FIntCVar::operator_cast_to_int(&mod_autochip_scan_threshold);
  iVar6 = (iVar6 * 0x10000 + 0x32) / 100;
  pDVar11 = duh_get_it_sigdata((DUH *)0x42928d);
  if (pDVar11 != (DUMB_IT_SIGDATA *)0x0) {
    sample._4_4_ = 0;
    iVar1 = pDVar11->n_samples;
    for (; sample._4_4_ < iVar1; sample._4_4_ = sample._4_4_ + 1) {
      pIVar2 = pDVar11->sample;
      if ((pIVar2[sample._4_4_].flags & 1) != 0) {
        iVar10 = 1;
        if ((pIVar2[sample._4_4_].flags & 4) != 0) {
          iVar10 = 2;
        }
        if (pIVar2[sample._4_4_].length < iVar3) {
          pIVar2[sample._4_4_].max_resampling_quality = 0;
        }
        else if (pIVar2[sample._4_4_].length < iVar4) {
          if ((pIVar2[sample._4_4_].flags & 0x50) != 0x10) goto LAB_004294cc;
          iVar7 = pIVar2[sample._4_4_].loop_start * iVar10;
          iVar8 = pIVar2[sample._4_4_].loop_end * iVar10;
          if ((pIVar2[sample._4_4_].flags & 2) == 0) {
            iVar9 = (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)iVar7) -
                    (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)(iVar8 - iVar10));
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            if (iVar9 <= iVar5) {
              if (iVar10 == 2) {
                iVar7 = (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)(iVar7 + 1)) -
                        (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)(iVar8 + -1));
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                if (iVar5 < iVar7) {
                  pIVar2[sample._4_4_].max_resampling_quality = 0;
                  goto LAB_00429864;
                }
              }
              goto LAB_004294cc;
            }
            pIVar2[sample._4_4_].max_resampling_quality = 0;
          }
          else {
            iVar9 = (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)iVar7 * 2) -
                    (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)(iVar8 - iVar10) * 2);
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            if (iVar6 < iVar9) {
              pIVar2[sample._4_4_].max_resampling_quality = 0;
            }
            else {
              if (iVar10 == 2) {
                iVar7 = (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)(iVar7 + 1) * 2) -
                        (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)(iVar8 + -1) * 2);
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                if (iVar6 < iVar7) {
                  pIVar2[sample._4_4_].max_resampling_quality = 0;
                  goto LAB_00429864;
                }
              }
LAB_004294cc:
              if ((pIVar2[sample._4_4_].flags & 0xa0) != 0x20) goto LAB_00429669;
              iVar7 = pIVar2[sample._4_4_].sus_loop_start * iVar10;
              iVar8 = pIVar2[sample._4_4_].sus_loop_end * iVar10;
              if ((pIVar2[sample._4_4_].flags & 2) == 0) {
                iVar9 = (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)iVar7) -
                        (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)(iVar8 - iVar10));
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                if (iVar9 <= iVar5) {
                  if (iVar10 == 2) {
                    iVar7 = (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)(iVar7 + 1)) -
                            (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)(iVar8 + -1));
                    if (iVar7 < 1) {
                      iVar7 = -iVar7;
                    }
                    if (iVar5 < iVar7) {
                      pIVar2[sample._4_4_].max_resampling_quality = 0;
                      goto LAB_00429864;
                    }
                  }
                  goto LAB_00429669;
                }
                pIVar2[sample._4_4_].max_resampling_quality = 0;
              }
              else {
                iVar9 = (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)iVar7 * 2) -
                        (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)(iVar8 - iVar10) * 2
                                       );
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                if (iVar6 < iVar9) {
                  pIVar2[sample._4_4_].max_resampling_quality = 0;
                }
                else {
                  if (iVar10 == 2) {
                    iVar7 = (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)(iVar7 + 1) * 2)
                            - (int)*(short *)((long)pIVar2[sample._4_4_].data +
                                             (long)(iVar8 + -1) * 2);
                    if (iVar7 < 1) {
                      iVar7 = -iVar7;
                    }
                    if (iVar6 < iVar7) {
                      pIVar2[sample._4_4_].max_resampling_quality = 0;
                      goto LAB_00429864;
                    }
                  }
LAB_00429669:
                  local_64 = pIVar2[sample._4_4_].length;
                  if ((pIVar2[sample._4_4_].flags & 0x10) != 0) {
                    local_64 = pIVar2[sample._4_4_].loop_end;
                  }
                  local_64 = local_64 * iVar10;
                  local_60 = iVar10;
                  if ((pIVar2[sample._4_4_].flags & 2) == 0) {
                    for (; local_60 < local_64; local_60 = iVar10 + local_60) {
                      iVar7 = (int)*(char *)((long)pIVar2[sample._4_4_].data +
                                            (long)(local_60 - iVar10)) -
                              (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)local_60);
                      if (iVar7 < 1) {
                        iVar7 = -iVar7;
                      }
                      if (iVar5 < iVar7) break;
                    }
                    if (local_60 < local_64) {
                      pIVar2[sample._4_4_].max_resampling_quality = 0;
                    }
                    else {
                      if (iVar10 == 2) {
                        for (local_60 = 3; local_60 < local_64; local_60 = local_60 + 2) {
                          iVar10 = (int)*(char *)((long)pIVar2[sample._4_4_].data +
                                                 (long)(local_60 + -2)) -
                                   (int)*(char *)((long)pIVar2[sample._4_4_].data + (long)local_60);
                          if (iVar10 < 1) {
                            iVar10 = -iVar10;
                          }
                          if (iVar5 < iVar10) break;
                        }
                      }
                      if (local_60 < local_64) {
                        pIVar2[sample._4_4_].max_resampling_quality = 0;
                      }
                    }
                  }
                  else {
                    for (; local_60 < local_64; local_60 = iVar10 + local_60) {
                      iVar7 = (int)*(short *)((long)pIVar2[sample._4_4_].data +
                                             (long)(local_60 - iVar10) * 2) -
                              (int)*(short *)((long)pIVar2[sample._4_4_].data + (long)local_60 * 2);
                      if (iVar7 < 1) {
                        iVar7 = -iVar7;
                      }
                      if (iVar6 < iVar7) break;
                    }
                    if (local_60 < local_64) {
                      pIVar2[sample._4_4_].max_resampling_quality = 0;
                    }
                    else {
                      if (iVar10 == 2) {
                        for (local_60 = 3; local_60 < local_64; local_60 = local_60 + 2) {
                          iVar10 = (int)*(short *)((long)pIVar2[sample._4_4_].data +
                                                  (long)(local_60 + -2) * 2) -
                                   (int)*(short *)((long)pIVar2[sample._4_4_].data +
                                                  (long)local_60 * 2);
                          if (iVar10 < 1) {
                            iVar10 = -iVar10;
                          }
                          if (iVar6 < iVar10) break;
                        }
                      }
                      if (local_60 < local_64) {
                        pIVar2[sample._4_4_].max_resampling_quality = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00429864:
    }
  }
  return;
}

Assistant:

static void MOD_SetAutoChip(DUH *duh)
{
	int size_force = mod_autochip_size_force;
	int size_scan = mod_autochip_size_scan;
	int scan_threshold_8 = ((mod_autochip_scan_threshold * 0x100) + 50) / 100;
	int scan_threshold_16 = ((mod_autochip_scan_threshold * 0x10000) + 50) / 100;
	DUMB_IT_SIGDATA * itsd = duh_get_it_sigdata(duh);

	if (itsd)
	{
		for (int i = 0, j = itsd->n_samples; i < j; i++)
		{
			IT_SAMPLE * sample = &itsd->sample[i];
			if (sample->flags & IT_SAMPLE_EXISTS)
			{
				int channels = sample->flags & IT_SAMPLE_STEREO ? 2 : 1;
				if (sample->length < size_force) sample->max_resampling_quality = 0;
				else if (sample->length < size_scan)
				{
					if ((sample->flags & (IT_SAMPLE_LOOP|IT_SAMPLE_PINGPONG_LOOP)) == IT_SAMPLE_LOOP)
					{
						int loop_start = sample->loop_start * channels;
						int loop_end = sample->loop_end * channels;
						int s1, s2;
						if (sample->flags & IT_SAMPLE_16BIT)
						{
							s1 = ((signed short *)sample->data)[loop_start];
							s2 = ((signed short *)sample->data)[loop_end - channels];
							if (abs(s1 - s2) > scan_threshold_16)
							{
								sample->max_resampling_quality = 0;
								continue;
							}
							if (channels == 2)
							{
								s1 = ((signed short *)sample->data)[loop_start + 1];
								s2 = ((signed short *)sample->data)[loop_end - 1];
								if (abs(s1 - s2) > scan_threshold_16)
								{
									sample->max_resampling_quality = 0;
									continue;
								}
							}
						}
						else
						{
							s1 = ((signed char *)sample->data)[loop_start];
							s2 = ((signed char *)sample->data)[loop_end - channels];
							if (abs(s1 - s2) > scan_threshold_8)
							{
								sample->max_resampling_quality = 0;
								continue;
							}
							if (channels == 2)
							{
								s1 = ((signed char *)sample->data)[loop_start + 1];
								s2 = ((signed char *)sample->data)[loop_end - 1];
								if (abs(s1 - s2) > scan_threshold_8)
								{
									sample->max_resampling_quality = 0;
									continue;
								}
							}
						}
					}
					if ((sample->flags & (IT_SAMPLE_SUS_LOOP|IT_SAMPLE_PINGPONG_SUS_LOOP)) == IT_SAMPLE_SUS_LOOP)
					{
						int sus_loop_start = sample->sus_loop_start * channels;
						int sus_loop_end = sample->sus_loop_end * channels;
						int s1, s2;
						if (sample->flags & IT_SAMPLE_16BIT)
						{
							s1 = ((signed short *)sample->data)[sus_loop_start];
							s2 = ((signed short *)sample->data)[sus_loop_end - channels];
							if (abs(s1 - s2) > scan_threshold_16)
							{
								sample->max_resampling_quality = 0;
								continue;
							}
							if (channels == 2)
							{
								s1 = ((signed short *)sample->data)[sus_loop_start + 1];
								s2 = ((signed short *)sample->data)[sus_loop_end - 1];
								if (abs(s1 - s2) > scan_threshold_16)
								{
									sample->max_resampling_quality = 0;
									continue;
								}
							}
						}
						else
						{
							s1 = ((signed char *)sample->data)[sus_loop_start];
							s2 = ((signed char *)sample->data)[sus_loop_end - channels];
							if (abs(s1 - s2) > scan_threshold_8)
							{
								sample->max_resampling_quality = 0;
								continue;
							}
							if (channels == 2)
							{
								s1 = ((signed char *)sample->data)[sus_loop_start + 1];
								s2 = ((signed char *)sample->data)[sus_loop_end - 1];
								if (abs(s1 - s2) > scan_threshold_8)
								{
									sample->max_resampling_quality = 0;
									continue;
								}
							}
						}
					}

					int k, l = sample->length * channels;
					if (sample->flags & IT_SAMPLE_LOOP) l = sample->loop_end * channels;
					if (sample->flags & IT_SAMPLE_16BIT)
					{
						for (k = channels; k < l; k += channels)
						{
							if (abs(((signed short *)sample->data)[k - channels] - ((signed short *)sample->data)[k]) > scan_threshold_16)
							{
								break;
							}
						}
						if (k < l)
						{
							sample->max_resampling_quality = 0;
							continue;
						}
						if (channels == 2)
						{
							for (k = 2 + 1; k < l; k += 2)
							{
								if (abs(((signed short *)sample->data)[k - 2] - ((signed short *)sample->data)[k]) > scan_threshold_16)
								{
									break;
								}
							}
						}
						if (k < l)
						{
							sample->max_resampling_quality = 0;
							continue;
						}
					}
					else
					{
						for (k = channels; k < l; k += channels)
						{
							if (abs(((signed char *)sample->data)[k - channels] - ((signed char *)sample->data)[k]) > scan_threshold_8)
							{
								break;
							}
						}
						if (k < l)
						{
							sample->max_resampling_quality = 0;
							continue;
						}
						if (channels == 2)
						{
							for (k = 2 + 1; k < l; k += 2)
							{
								if (abs(((signed char *)sample->data)[k - 2] - ((signed char *)sample->data)[k]) > scan_threshold_8)
								{
									break;
								}
							}
						}
						if (k < l)
						{
							sample->max_resampling_quality = 0;
							continue;
						}
					}
				}
			}
		}
	}
}